

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

void __thiscall
t_php_generator::generate_deserialize_container
          (t_php_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  int *piVar1;
  t_type *ptVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  string *psVar6;
  string i;
  string size;
  string etype;
  string vtype;
  string ktype;
  t_field fsize;
  t_field fetype;
  t_field fvtype;
  t_field fktype;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  t_field local_2f0;
  t_field local_240;
  t_field local_190;
  t_field local_e0;
  
  std::__cxx11::string::string((string *)&local_370,"_size",(allocator *)&local_2f0);
  t_generator::tmp(&local_5d0,(t_generator *)this,&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::string((string *)&local_390,"_ktype",(allocator *)&local_2f0);
  t_generator::tmp(&local_570,(t_generator *)this,&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::string((string *)&local_3b0,"_vtype",(allocator *)&local_2f0);
  t_generator::tmp(&local_590,(t_generator *)this,&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::string((string *)&local_3d0,"_etype",(allocator *)&local_2f0);
  t_generator::tmp(&local_5b0,(t_generator *)this,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  ptVar2 = g_type_i32;
  std::__cxx11::string::string((string *)&local_3f0,(string *)&local_5d0);
  t_field::t_field(&local_2f0,ptVar2,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  ptVar2 = g_type_i8;
  std::__cxx11::string::string((string *)&local_410,(string *)&local_570);
  t_field::t_field(&local_e0,ptVar2,&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  ptVar2 = g_type_i8;
  std::__cxx11::string::string((string *)&local_430,(string *)&local_590);
  t_field::t_field(&local_190,ptVar2,&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  ptVar2 = g_type_i8;
  std::__cxx11::string::string((string *)&local_450,(string *)&local_5b0);
  t_field::t_field(&local_240,ptVar2,&local_450);
  std::__cxx11::string::~string((string *)&local_450);
  t_generator::indent_abi_cxx11_(&local_610,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_610);
  poVar4 = std::operator<<(poVar4,"$");
  poVar4 = std::operator<<(poVar4,(string *)prefix);
  poVar4 = std::operator<<(poVar4," = array();");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_5f0,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_5f0);
  poVar4 = std::operator<<(poVar4,"$");
  poVar4 = std::operator<<(poVar4,(string *)&local_5d0);
  poVar4 = std::operator<<(poVar4," = 0;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_610);
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar3 == '\0') {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar3 != '\0') {
      if (this->binary_inline_ != true) {
        t_generator::indent_abi_cxx11_(&local_610,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_610);
        poVar4 = std::operator<<(poVar4,"$");
        poVar4 = std::operator<<(poVar4,(string *)&local_5b0);
        poVar4 = std::operator<<(poVar4," = 0;");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_5f0,(t_generator *)this);
        poVar4 = std::operator<<(poVar4,(string *)&local_5f0);
        poVar4 = std::operator<<(poVar4,"$xfer += $input->readSetBegin(");
        poVar4 = std::operator<<(poVar4,"$");
        poVar4 = std::operator<<(poVar4,(string *)&local_5b0);
        poVar4 = std::operator<<(poVar4,", $");
        poVar4 = std::operator<<(poVar4,(string *)&local_5d0);
        poVar4 = std::operator<<(poVar4,");");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
LAB_0027c595:
        std::__cxx11::string::~string((string *)&local_5f0);
        goto LAB_0027c59f;
      }
      std::__cxx11::string::string((string *)&local_4d0,"",(allocator *)&local_610);
      generate_deserialize_field(this,out,&local_240,&local_4d0,false);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::__cxx11::string::string((string *)&local_4f0,"",(allocator *)&local_610);
      generate_deserialize_field(this,out,&local_2f0,&local_4f0,false);
      psVar6 = &local_4f0;
      goto LAB_0027c5a4;
    }
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar3 != '\0') {
      if (this->binary_inline_ != true) {
        t_generator::indent_abi_cxx11_(&local_610,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_610);
        poVar4 = std::operator<<(poVar4,"$");
        poVar4 = std::operator<<(poVar4,(string *)&local_5b0);
        poVar4 = std::operator<<(poVar4," = 0;");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_5f0,(t_generator *)this);
        poVar4 = std::operator<<(poVar4,(string *)&local_5f0);
        poVar4 = std::operator<<(poVar4,"$xfer += $input->readListBegin(");
        poVar4 = std::operator<<(poVar4,"$");
        poVar4 = std::operator<<(poVar4,(string *)&local_5b0);
        poVar4 = std::operator<<(poVar4,", $");
        poVar4 = std::operator<<(poVar4,(string *)&local_5d0);
        poVar4 = std::operator<<(poVar4,");");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        goto LAB_0027c595;
      }
      std::__cxx11::string::string((string *)&local_510,"",(allocator *)&local_610);
      generate_deserialize_field(this,out,&local_240,&local_510,false);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::string((string *)&local_530,"",(allocator *)&local_610);
      generate_deserialize_field(this,out,&local_2f0,&local_530,false);
      psVar6 = &local_530;
      goto LAB_0027c5a4;
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_610,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_610);
    poVar4 = std::operator<<(poVar4,"$");
    poVar4 = std::operator<<(poVar4,(string *)&local_570);
    poVar4 = std::operator<<(poVar4," = 0;");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_5f0,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_5f0);
    poVar4 = std::operator<<(poVar4,"$");
    poVar4 = std::operator<<(poVar4,(string *)&local_590);
    poVar4 = std::operator<<(poVar4," = 0;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_5f0);
    std::__cxx11::string::~string((string *)&local_610);
    if (this->binary_inline_ == true) {
      std::__cxx11::string::string((string *)&local_470,"",(allocator *)&local_610);
      generate_deserialize_field(this,out,&local_e0,&local_470,false);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::string((string *)&local_490,"",(allocator *)&local_610);
      generate_deserialize_field(this,out,&local_190,&local_490,false);
      std::__cxx11::string::~string((string *)&local_490);
      std::__cxx11::string::string((string *)&local_4b0,"",(allocator *)&local_610);
      generate_deserialize_field(this,out,&local_2f0,&local_4b0,false);
      psVar6 = &local_4b0;
    }
    else {
      t_generator::indent_abi_cxx11_(&local_610,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_610);
      poVar4 = std::operator<<(poVar4,"$xfer += $input->readMapBegin(");
      poVar4 = std::operator<<(poVar4,"$");
      poVar4 = std::operator<<(poVar4,(string *)&local_570);
      poVar4 = std::operator<<(poVar4,", $");
      poVar4 = std::operator<<(poVar4,(string *)&local_590);
      poVar4 = std::operator<<(poVar4,", $");
      poVar4 = std::operator<<(poVar4,(string *)&local_5d0);
      poVar4 = std::operator<<(poVar4,");");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
LAB_0027c59f:
      psVar6 = &local_610;
    }
LAB_0027c5a4:
    std::__cxx11::string::~string((string *)psVar6);
  }
  std::__cxx11::string::string((string *)&local_550,"_i",(allocator *)&local_5f0);
  t_generator::tmp(&local_610,(t_generator *)this,&local_550);
  std::__cxx11::string::~string((string *)&local_550);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"for ($");
  poVar4 = std::operator<<(poVar4,(string *)&local_610);
  poVar4 = std::operator<<(poVar4," = 0; $");
  poVar4 = std::operator<<(poVar4,(string *)&local_610);
  poVar4 = std::operator<<(poVar4," < $");
  poVar4 = std::operator<<(poVar4,(string *)&local_5d0);
  poVar4 = std::operator<<(poVar4,"; ++$");
  poVar4 = std::operator<<(poVar4,(string *)&local_610);
  poVar4 = std::operator<<(poVar4,") {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar3 == '\0') {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar3 != '\0') {
      psVar6 = &local_330;
      std::__cxx11::string::string((string *)psVar6,(string *)prefix);
      generate_deserialize_set_element(this,out,(t_set *)ttype,psVar6);
      goto LAB_0027c71e;
    }
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar3 != '\0') {
      psVar6 = &local_350;
      std::__cxx11::string::string((string *)psVar6,(string *)prefix);
      generate_deserialize_list_element(this,out,(t_list *)ttype,psVar6);
      goto LAB_0027c71e;
    }
  }
  else {
    psVar6 = &local_310;
    std::__cxx11::string::string((string *)psVar6,(string *)prefix);
    generate_deserialize_map_element(this,out,(t_map *)ttype,psVar6);
LAB_0027c71e:
    std::__cxx11::string::~string((string *)psVar6);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  if (this->binary_inline_ == false) {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
      if ((char)iVar3 == '\0') {
        iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
        if ((char)iVar3 == '\0') goto LAB_0027c7b6;
        poVar4 = t_generator::indent((t_generator *)this,out);
        pcVar5 = "$xfer += $input->readListEnd();";
      }
      else {
        poVar4 = t_generator::indent((t_generator *)this,out);
        pcVar5 = "$xfer += $input->readSetEnd();";
      }
    }
    else {
      poVar4 = t_generator::indent((t_generator *)this,out);
      pcVar5 = "$xfer += $input->readMapEnd();";
    }
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
LAB_0027c7b6:
  std::__cxx11::string::~string((string *)&local_610);
  t_field::~t_field(&local_240);
  t_field::~t_field(&local_190);
  t_field::~t_field(&local_e0);
  t_field::~t_field(&local_2f0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_5d0);
  return;
}

Assistant:

void t_php_generator::generate_deserialize_container(ostream& out, t_type* ttype, string prefix) {
  string size = tmp("_size");
  string ktype = tmp("_ktype");
  string vtype = tmp("_vtype");
  string etype = tmp("_etype");

  t_field fsize(g_type_i32, size);
  t_field fktype(g_type_i8, ktype);
  t_field fvtype(g_type_i8, vtype);
  t_field fetype(g_type_i8, etype);

  out << indent() << "$" << prefix << " = array();" << endl << indent() << "$" << size << " = 0;"
      << endl;

  // Declare variables, read header
  if (ttype->is_map()) {
    out << indent() << "$" << ktype << " = 0;" << endl << indent() << "$" << vtype << " = 0;"
        << endl;
    if (binary_inline_) {
      generate_deserialize_field(out, &fktype);
      generate_deserialize_field(out, &fvtype);
      generate_deserialize_field(out, &fsize);
    } else {
      out << indent() << "$xfer += $input->readMapBegin("
          << "$" << ktype << ", $" << vtype << ", $" << size << ");" << endl;
    }
  } else if (ttype->is_set()) {
    if (binary_inline_) {
      generate_deserialize_field(out, &fetype);
      generate_deserialize_field(out, &fsize);
    } else {
      out << indent() << "$" << etype << " = 0;" << endl << indent()
          << "$xfer += $input->readSetBegin("
          << "$" << etype << ", $" << size << ");" << endl;
    }
  } else if (ttype->is_list()) {
    if (binary_inline_) {
      generate_deserialize_field(out, &fetype);
      generate_deserialize_field(out, &fsize);
    } else {
      out << indent() << "$" << etype << " = 0;" << endl << indent()
          << "$xfer += $input->readListBegin("
          << "$" << etype << ", $" << size << ");" << endl;
    }
  }

  // For loop iterates over elements
  string i = tmp("_i");
  indent(out) << "for ($" << i << " = 0; $" << i << " < $" << size << "; ++$" << i << ") {" << endl;

  indent_up();

  if (ttype->is_map()) {
    generate_deserialize_map_element(out, (t_map*)ttype, prefix);
  } else if (ttype->is_set()) {
    generate_deserialize_set_element(out, (t_set*)ttype, prefix);
  } else if (ttype->is_list()) {
    generate_deserialize_list_element(out, (t_list*)ttype, prefix);
  }

  scope_down(out);

  if (!binary_inline_) {
    // Read container end
    if (ttype->is_map()) {
      indent(out) << "$xfer += $input->readMapEnd();" << endl;
    } else if (ttype->is_set()) {
      indent(out) << "$xfer += $input->readSetEnd();" << endl;
    } else if (ttype->is_list()) {
      indent(out) << "$xfer += $input->readListEnd();" << endl;
    }
  }
}